

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

optional<long> __thiscall
anon_unknown.dwarf_33386e4::AddressDescriptor::ScriptSize(AddressDescriptor *this)

{
  long lVar1;
  undefined8 extraout_RDX;
  long in_FS_OFFSET;
  optional<long> oVar2;
  CTxDestination *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff98;
  undefined8 local_38;
  undefined1 local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination(in_stack_ffffffffffffff88);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffff98);
  std::optional<long>::optional<unsigned_int,_true>
            ((optional<long> *)in_stack_ffffffffffffff98,
             (uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  CScript::~CScript((CScript *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)extraout_RDX >> 8);
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_30;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_38;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override { return GetScriptForDestination(m_destination).size(); }